

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::cpp::CppGenerator::CppGenerator(CppGenerator *this)

{
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__CppGenerator_003132d0;
  this->opensource_runtime_ = true;
  (this->runtime_include_base_)._M_dataplus._M_p = (pointer)&(this->runtime_include_base_).field_2;
  (this->runtime_include_base_)._M_string_length = 0;
  (this->runtime_include_base_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

CppGenerator::CppGenerator() {}